

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketClient.cpp
# Opt level: O0

int __thiscall SocketClient::init(SocketClient *this,EVP_PKEY_CTX *ctx)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  element_type *this_00;
  SocketClient *pSVar4;
  SocketClient *local_88;
  code *local_80;
  undefined8 local_78;
  type local_70;
  function<void_(int,_unsigned_int)> local_58;
  undefined1 local_38 [8];
  SharedPtr loop;
  int local_20;
  int type;
  int domain;
  uint mode_local;
  SocketClient *this_local;
  
  local_20 = -1;
  loop.super___shared_ptr<EventLoop,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ = -1;
  uVar2 = (uint)ctx & 7;
  if (uVar2 == 1) {
    loop.super___shared_ptr<EventLoop,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ = 1;
    local_20 = 2;
    if (((ulong)ctx & 8) != 0) {
      local_20 = 10;
    }
  }
  else if (uVar2 == 2) {
    loop.super___shared_ptr<EventLoop,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ = 2;
    local_20 = 2;
    if (((ulong)ctx & 8) != 0) {
      local_20 = 10;
    }
  }
  else if (uVar2 == 4) {
    loop.super___shared_ptr<EventLoop,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ = 1;
    if (((ulong)ctx & 8) != 0) {
      __assert_fail("!(mode & IPv6)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Gei0r[P]rct/rct/SocketClient.cpp"
                    ,0x309,"bool SocketClient::init(unsigned int)");
    }
    local_20 = 1;
  }
  iVar3 = socket(local_20,loop.super___shared_ptr<EventLoop,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                          ._M_pi._4_4_,0);
  this->mFd = iVar3;
  if (this->mFd < 0) {
    this_local._7_1_ = 0;
    pSVar4 = this;
    goto LAB_00284b69;
  }
  setFlags(this->mFd,1,1,2,FlagAppend);
  if ((this->mBlocking & 1U) == 0) {
    EventLoop::eventLoop();
    bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_38);
    if (bVar1) {
      this_00 = std::__shared_ptr_access<EventLoop,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<EventLoop,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)local_38);
      iVar3 = this->mFd;
      local_80 = socketCallback;
      local_78 = 0;
      local_88 = this;
      std::
      bind<void(SocketClient::*)(int,int),SocketClient*,std::_Placeholder<1>const&,std::_Placeholder<2>const&>
                (&local_70,(offset_in_SocketClient_to_subr *)&local_80,&local_88,
                 (_Placeholder<1> *)&std::placeholders::_1,(_Placeholder<2> *)&std::placeholders::_2
                );
      std::function<void(int,unsigned_int)>::
      function<std::_Bind<void(SocketClient::*(SocketClient*,std::_Placeholder<1>,std::_Placeholder<2>))(int,int)>,void>
                ((function<void(int,unsigned_int)> *)&local_58,&local_70);
      EventLoop::registerSocket(this_00,iVar3,1,&local_58);
      std::function<void_(int,_unsigned_int)>::~function(&local_58);
      iVar3 = 0x800;
      bVar1 = setFlags(this->mFd,0x800,3,4,FlagAppend);
      if (bVar1) goto LAB_00284b2a;
      close(this,iVar3);
      this_local._7_1_ = 0;
      bVar1 = true;
    }
    else {
LAB_00284b2a:
      bVar1 = false;
    }
    std::shared_ptr<EventLoop>::~shared_ptr((shared_ptr<EventLoop> *)local_38);
    pSVar4 = (SocketClient *)0x0;
    if (bVar1) goto LAB_00284b69;
  }
  this->mSocketMode = (uint)ctx;
  this_local._7_1_ = 1;
  pSVar4 = this;
LAB_00284b69:
  return (uint)CONCAT71((int7)((ulong)pSVar4 >> 8),this_local._7_1_) & 0xffffff01;
}

Assistant:

bool SocketClient::init(unsigned int mode)
{
    int domain = -1, type = -1;
    switch (mode & (Udp|Tcp|Unix)) {
    case Udp:
        type = SOCK_DGRAM;
        domain = (mode & IPv6) ? AF_INET6 : AF_INET;
        break;
    case Tcp:
        type = SOCK_STREAM;
        domain = (mode & IPv6) ? AF_INET6 : AF_INET;
        break;
    case Unix:
        type = SOCK_STREAM;
        assert(!(mode & IPv6));
        domain = PF_UNIX;
        break;
    }

    mFd = ::socket(domain, type, 0);
    if (mFd < 0) {
        // bad
        return false;
    }
#ifdef HAVE_NOSIGPIPE
    int flags = 1;
    ::setsockopt(mFd, SOL_SOCKET, SO_NOSIGPIPE, (void *)&flags, sizeof(int));
#endif
#ifdef HAVE_CLOEXEC
    setFlags(mFd, FD_CLOEXEC, F_GETFD, F_SETFD);
#endif

    if (!mBlocking) {
        if (EventLoop::SharedPtr loop = EventLoop::eventLoop()) {
            loop->registerSocket(mFd, EventLoop::SocketRead,
                                 std::bind(&SocketClient::socketCallback, this, std::placeholders::_1, std::placeholders::_2));
#ifndef _WIN32   // no O_NONBLOCK on windows
            if (!setFlags(mFd, O_NONBLOCK, F_GETFL, F_SETFL)) {
                close();
                return false;
            }
#endif
        }
    }

    mSocketMode = mode;
    return true;
}